

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_api_dump.cpp
# Opt level: O1

bool ApiDumpOutputXrStruct
               (XrGeneratedDispatchTable *gen_dispatch_table,
               XrScenePlaneAlignmentFilterInfoMSFT *value,string *prefix,string *type_string,
               bool is_pointer,
               vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *contents)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  byte bVar2;
  XrStructureType XVar3;
  XrScenePlaneAlignmentTypeMSFT XVar4;
  pointer pcVar5;
  PFN_xrStructureTypeToString p_Var6;
  void *value_00;
  XrStructureType __val;
  XrScenePlaneAlignmentTypeMSFT __val_00;
  uint uVar7;
  char cVar8;
  bool bVar9;
  char cVar10;
  uint uVar11;
  char *pcVar12;
  XrInstance pXVar13;
  invalid_argument *this;
  long lVar14;
  ulong uVar15;
  uint uVar16;
  ulong uVar17;
  string type_prefix;
  string __str_1;
  string alignments_array_prefix;
  string alignments_prefix;
  string next_prefix;
  string alignmentcount_prefix;
  ostringstream oss_alignmentCount;
  ostringstream oss_alignments_array;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_408;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3a8;
  long *local_388;
  long local_380;
  long local_378 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_368;
  string local_348;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_328;
  undefined8 local_308;
  undefined8 uStack_300;
  undefined8 local_2f8;
  undefined8 uStack_2f0;
  ios_base local_2b8 [272];
  undefined1 local_1a8 [24];
  uint auStack_190 [22];
  ios_base local_138 [264];
  
  local_328._M_dataplus._M_p = (pointer)&local_328.field_2;
  local_1a8._0_8_ = value;
  std::__cxx11::string::_M_construct((ulong)&local_328,'\x12');
  *local_328._M_dataplus._M_p = '0';
  local_328._M_dataplus._M_p[1] = 'x';
  pcVar12 = local_328._M_dataplus._M_p + (local_328._M_string_length - 1);
  lVar14 = 0;
  do {
    bVar2 = local_1a8[lVar14];
    *pcVar12 = to_hex[abi:cxx11](unsigned_char_const*,unsigned_long)::hex[bVar2 & 0xf];
    pcVar12[-1] = to_hex[abi:cxx11](unsigned_char_const*,unsigned_long)::hex[bVar2 >> 4];
    lVar14 = lVar14 + 1;
    pcVar12 = pcVar12 + -2;
  } while (lVar14 != 8);
  std::
  vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
  ::emplace_back<std::__cxx11::string&,std::__cxx11::string&,std::__cxx11::string>
            ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
              *)contents,type_string,prefix,&local_328);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_328._M_dataplus._M_p != &local_328.field_2) {
    operator_delete(local_328._M_dataplus._M_p,local_328.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::string::append((char *)prefix);
  local_408._M_dataplus._M_p = (pointer)&local_408.field_2;
  pcVar5 = (prefix->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_408,pcVar5,pcVar5 + prefix->_M_string_length);
  std::__cxx11::string::append((char *)&local_408);
  if (gen_dispatch_table == (XrGeneratedDispatchTable *)0x0) {
    XVar3 = value->type;
    __val = -XVar3;
    if (0 < (int)XVar3) {
      __val = XVar3;
    }
    uVar16 = 1;
    if (XR_TYPE_SWAPCHAIN_CREATE_INFO < __val) {
      uVar17 = (ulong)__val;
      uVar7 = 4;
      do {
        uVar16 = uVar7;
        uVar11 = (uint)uVar17;
        if (uVar11 < 100) {
          uVar16 = uVar16 - 2;
          goto LAB_0018aaf6;
        }
        if (uVar11 < 1000) {
          uVar16 = uVar16 - 1;
          goto LAB_0018aaf6;
        }
        if (uVar11 < 10000) goto LAB_0018aaf6;
        uVar17 = uVar17 / 10000;
        uVar7 = uVar16 + 4;
      } while (99999 < uVar11);
      uVar16 = uVar16 + 1;
    }
LAB_0018aaf6:
    local_328._M_dataplus._M_p = (pointer)&local_328.field_2;
    std::__cxx11::string::_M_construct((ulong)&local_328,(char)uVar16 - (char)((int)XVar3 >> 0x1f));
    std::__detail::__to_chars_10_impl<unsigned_int>
              (local_328._M_dataplus._M_p + (XVar3 >> 0x1f),uVar16,__val);
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[16],std::__cxx11::string&,std::__cxx11::string>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)contents,(char (*) [16])"XrStructureType",&local_408,&local_328);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_328._M_dataplus._M_p != &local_328.field_2) {
      operator_delete(local_328._M_dataplus._M_p,local_328.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    local_2f8 = 0;
    uStack_2f0 = 0;
    local_308 = 0;
    uStack_300 = 0;
    local_328.field_2._M_allocated_capacity = 0;
    local_328.field_2._8_8_ = 0;
    local_328._M_dataplus._M_p = (pointer)0x0;
    local_328._M_string_length = 0;
    p_Var6 = gen_dispatch_table->StructureTypeToString;
    pXVar13 = FindInstanceFromDispatchTable(gen_dispatch_table);
    (*p_Var6)(pXVar13,value->type,(char *)&local_328);
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[16],std::__cxx11::string&,char(&)[64]>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)contents,(char (*) [16])"XrStructureType",&local_408,(char (*) [64])&local_328);
  }
  local_388 = local_378;
  pcVar5 = (prefix->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_388,pcVar5,pcVar5 + prefix->_M_string_length);
  std::__cxx11::string::append((char *)&local_388);
  value_00 = value->next;
  local_348._M_dataplus._M_p = (pointer)&local_348.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_348,local_388,local_380 + (long)local_388);
  bVar9 = ApiDumpDecodeNextChain(gen_dispatch_table,value_00,&local_348,contents);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_348._M_dataplus._M_p != &local_348.field_2) {
    operator_delete(local_348._M_dataplus._M_p,local_348.field_2._M_allocated_capacity + 1);
  }
  if (!bVar9) {
    this = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(this,"Invalid Operation");
    __cxa_throw(this,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  local_368._M_dataplus._M_p = (pointer)&local_368.field_2;
  pcVar5 = (prefix->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_368,pcVar5,pcVar5 + prefix->_M_string_length);
  std::__cxx11::string::append((char *)&local_368);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_328);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_328,"0x",2);
  *(uint *)((long)&local_328.field_2 + *(long *)(local_328._M_dataplus._M_p + -0x18) + 8) =
       *(uint *)((long)&local_328.field_2 + *(long *)(local_328._M_dataplus._M_p + -0x18) + 8) &
       0xffffffb5 | 8;
  std::ostream::_M_insert<unsigned_long>((ulong)&local_328);
  std::__cxx11::stringbuf::str();
  std::
  vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
  ::emplace_back<char_const(&)[9],std::__cxx11::string&,std::__cxx11::string>
            ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
              *)contents,(char (*) [9])"uint32_t",&local_368,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8);
  if ((XrScenePlaneAlignmentFilterInfoMSFT *)local_1a8._0_8_ !=
      (XrScenePlaneAlignmentFilterInfoMSFT *)(local_1a8 + 0x10)) {
    operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
  }
  local_3a8._M_dataplus._M_p = (pointer)&local_3a8.field_2;
  pcVar5 = (prefix->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_3a8,pcVar5,pcVar5 + prefix->_M_string_length);
  std::__cxx11::string::append((char *)&local_3a8);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  *(uint *)((long)auStack_190 + (long)*(void **)(local_1a8._0_8_ + -0x18)) =
       *(uint *)((long)auStack_190 + (long)*(void **)(local_1a8._0_8_ + -0x18)) & 0xffffffb5 | 8;
  std::ostream::_M_insert<void_const*>(local_1a8);
  std::__cxx11::stringbuf::str();
  std::
  vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
  ::emplace_back<char_const(&)[37],std::__cxx11::string&,std::__cxx11::string>
            ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
              *)contents,(char (*) [37])"const XrScenePlaneAlignmentTypeMSFT*",&local_3a8,&local_3c8
            );
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3c8._M_dataplus._M_p != &local_3c8.field_2) {
    operator_delete(local_3c8._M_dataplus._M_p,local_3c8.field_2._M_allocated_capacity + 1);
  }
  if (value->alignmentCount != 0) {
    paVar1 = &local_3e8.field_2;
    uVar17 = 0;
    do {
      local_3c8._M_dataplus._M_p = (pointer)&local_3c8.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_3c8,local_3a8._M_dataplus._M_p,
                 local_3a8._M_dataplus._M_p + local_3a8._M_string_length);
      std::__cxx11::string::append((char *)&local_3c8);
      cVar10 = '\x01';
      if (9 < uVar17) {
        uVar15 = uVar17;
        cVar8 = '\x04';
        do {
          cVar10 = cVar8;
          uVar16 = (uint)uVar15;
          if (uVar16 < 100) {
            cVar10 = cVar10 + -2;
            goto LAB_0018ae4d;
          }
          if (uVar16 < 1000) {
            cVar10 = cVar10 + -1;
            goto LAB_0018ae4d;
          }
          if (uVar16 < 10000) goto LAB_0018ae4d;
          uVar15 = (uVar15 & 0xffffffff) / 10000;
          cVar8 = cVar10 + '\x04';
        } while (99999 < uVar16);
        cVar10 = cVar10 + '\x01';
      }
LAB_0018ae4d:
      local_3e8._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct((ulong)&local_3e8,cVar10);
      std::__detail::__to_chars_10_impl<unsigned_int>
                (local_3e8._M_dataplus._M_p,(uint)local_3e8._M_string_length,(uint)uVar17);
      std::__cxx11::string::_M_append((char *)&local_3c8,(ulong)local_3e8._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3e8._M_dataplus._M_p != paVar1) {
        operator_delete(local_3e8._M_dataplus._M_p,local_3e8.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::string::append((char *)&local_3c8);
      XVar4 = value->alignments[uVar17];
      __val_00 = -XVar4;
      if (0 < (int)XVar4) {
        __val_00 = XVar4;
      }
      uVar16 = 1;
      if (9 < __val_00) {
        uVar15 = (ulong)__val_00;
        uVar7 = 4;
        do {
          uVar16 = uVar7;
          uVar11 = (uint)uVar15;
          if (uVar11 < 100) {
            uVar16 = uVar16 - 2;
            goto LAB_0018af13;
          }
          if (uVar11 < 1000) {
            uVar16 = uVar16 - 1;
            goto LAB_0018af13;
          }
          if (uVar11 < 10000) goto LAB_0018af13;
          uVar15 = uVar15 / 10000;
          uVar7 = uVar16 + 4;
        } while (99999 < uVar11);
        uVar16 = uVar16 + 1;
      }
LAB_0018af13:
      local_3e8._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct
                ((ulong)&local_3e8,(char)uVar16 - (char)((int)XVar4 >> 0x1f));
      std::__detail::__to_chars_10_impl<unsigned_int>
                (local_3e8._M_dataplus._M_p + (XVar4 >> 0x1f),uVar16,__val_00);
      std::
      vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
      ::emplace_back<char_const(&)[37],std::__cxx11::string&,std::__cxx11::string>
                ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                  *)contents,(char (*) [37])"const XrScenePlaneAlignmentTypeMSFT*",&local_3c8,
                 &local_3e8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3e8._M_dataplus._M_p != paVar1) {
        operator_delete(local_3e8._M_dataplus._M_p,local_3e8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3c8._M_dataplus._M_p != &local_3c8.field_2) {
        operator_delete(local_3c8._M_dataplus._M_p,local_3c8.field_2._M_allocated_capacity + 1);
      }
      uVar17 = uVar17 + 1;
    } while (uVar17 < value->alignmentCount);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base(local_138);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3a8._M_dataplus._M_p != &local_3a8.field_2) {
    operator_delete(local_3a8._M_dataplus._M_p,local_3a8.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_328);
  std::ios_base::~ios_base(local_2b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_368._M_dataplus._M_p != &local_368.field_2) {
    operator_delete(local_368._M_dataplus._M_p,local_368.field_2._M_allocated_capacity + 1);
  }
  if (local_388 != local_378) {
    operator_delete(local_388,local_378[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_408._M_dataplus._M_p != &local_408.field_2) {
    operator_delete(local_408._M_dataplus._M_p,local_408.field_2._M_allocated_capacity + 1);
  }
  return true;
}

Assistant:

bool ApiDumpOutputXrStruct(XrGeneratedDispatchTable* gen_dispatch_table, const XrScenePlaneAlignmentFilterInfoMSFT* value,
                           std::string prefix, std::string type_string, bool is_pointer,
                           std::vector<std::tuple<std::string, std::string, std::string>> &contents) {
    (void)gen_dispatch_table;  // silence warning
    try {
        contents.emplace_back(type_string, prefix, PointerToHexString(value));
        if (is_pointer) {
            prefix += "->";
        } else {
            prefix += ".";
        }
        std::string type_prefix = prefix;
        type_prefix += "type";
        if (nullptr != gen_dispatch_table) {
            char type_string[XR_MAX_STRUCTURE_NAME_SIZE] = {};
            gen_dispatch_table->StructureTypeToString(FindInstanceFromDispatchTable(gen_dispatch_table),
                                                      value->type, type_string);
            contents.emplace_back("XrStructureType", type_prefix, type_string);
        } else {
                        contents.emplace_back("XrStructureType", type_prefix, std::to_string(value->type));
        }
        std::string next_prefix = prefix;
        next_prefix += "next";
        // Decode the next chain if it exists
        if (!ApiDumpDecodeNextChain(gen_dispatch_table, value->next, next_prefix, contents)) {
            throw std::invalid_argument("Invalid Operation");
        }
        std::string alignmentcount_prefix = prefix;
        alignmentcount_prefix += "alignmentCount";
        std::ostringstream oss_alignmentCount;
        oss_alignmentCount << "0x" << std::hex << (value->alignmentCount);
        contents.emplace_back("uint32_t", alignmentcount_prefix, oss_alignmentCount.str());
        std::string alignments_prefix = prefix;
        alignments_prefix += "alignments";
        std::ostringstream oss_alignments_array;
        oss_alignments_array << std::hex << reinterpret_cast<const void*>(value->alignments);
        contents.emplace_back("const XrScenePlaneAlignmentTypeMSFT*", alignments_prefix, oss_alignments_array.str());
        for (uint32_t value_alignments_inc = 0; value_alignments_inc < value->alignmentCount; ++value_alignments_inc) {
            std::string alignments_array_prefix = alignments_prefix;
            alignments_array_prefix += "[";
            alignments_array_prefix += std::to_string(value_alignments_inc);
            alignments_array_prefix += "]";
            contents.emplace_back("const XrScenePlaneAlignmentTypeMSFT*", alignments_array_prefix, std::to_string(value->alignments[value_alignments_inc]));
        }
        return true;
    } catch(...) {
    }
    return false;
}